

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void expandFormatArguments<unsigned_long,unsigned_long>
               (vector<String,_std::allocator<String>_> *data,unsigned_long *arg,unsigned_long *rest
               )

{
  String local_38;
  
  String::fromNumber(&local_38,*arg);
  std::vector<String,_std::allocator<String>_>::push_back(data,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._string._M_dataplus._M_p != &local_38._string.field_2) {
    operator_delete(local_38._string._M_dataplus._M_p);
  }
  expandFormatArguments<unsigned_long>(data,rest);
  return;
}

Assistant:

void expandFormatArguments (std::vector<String>& data, const T& arg, const RestTypes& ... rest)
{
	data.push_back (FormatArgument (arg).text());
	expandFormatArguments (data, rest...);
}